

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfEvent.c
# Opt level: O0

void sbfEventQueueCb(sbfQueueItem item,void *closure)

{
  int iVar1;
  undefined4 *puVar2;
  undefined8 *in_RSI;
  sbfQueueItem in_RDI;
  int events;
  sbfEvent_conflict event;
  
  if (*(int *)(in_RSI + 4) == 0) {
    puVar2 = (undefined4 *)sbfQueue_getItemData(in_RDI);
    (*(code *)*in_RSI)(in_RSI,*puVar2,in_RSI[1]);
  }
  iVar1 = sbfRefCount_decrement((sbfRefCount *)((long)in_RSI + 0x24));
  if (iVar1 != 0) {
    free(in_RSI);
  }
  return;
}

Assistant:

static void
sbfEventQueueCb (sbfQueueItem item, void* closure)
{
    sbfEvent event = closure;
    int      events;

    if (!event->mDestroyed)
    {
        events = *(int*)sbfQueue_getItemData (item);
        event->mCb (event, events, event->mClosure);
    }

    if (sbfRefCount_decrement (&event->mRefCount))
        free (event);
}